

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O0

uint32_t ans_fold_mapping<3u>(uint32_t x)

{
  uint32_t digit;
  size_t thres;
  size_t offset;
  uint32_t radix_mask;
  uint32_t radix;
  uint32_t x_local;
  
  offset = 0;
  for (x_local = x; 0x3ff < x_local; x_local = x_local >> 8) {
    offset = offset + 0x3fc;
  }
  return x_local + (int)offset;
}

Assistant:

uint32_t ans_fold_mapping(uint32_t x)
{
    const uint32_t radix = 8;
    uint32_t radix_mask = ((1 << radix) - 1);
    size_t offset = 0;
    size_t thres = 1 << (fidelity + radix - 1);
    while (x >= thres) {
        auto digit = x & radix_mask;
        x = x >> radix;
        offset = offset + (1 << (fidelity - 1)) * radix_mask;
    }
    return x + offset;
}